

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding_function.cpp
# Opt level: O2

void duckdb::EncodingFunctionSet::Initialize(DBConfig *config)

{
  allocator local_71;
  string local_70;
  undefined1 local_50 [72];
  
  ::std::__cxx11::string::string((string *)&local_70,"utf-8",&local_71);
  EncodingFunction::EncodingFunction((EncodingFunction *)local_50,&local_70,DecodeUTF8,1,1);
  DBConfig::RegisterEncodeFunction(config,(EncodingFunction *)local_50);
  ::std::__cxx11::string::~string((string *)(local_50 + 0x10));
  ::std::__cxx11::string::~string((string *)&local_70);
  ::std::__cxx11::string::string((string *)&local_70,"latin-1",&local_71);
  EncodingFunction::EncodingFunction((EncodingFunction *)local_50,&local_70,DecodeLatin1ToUTF8,2,1);
  DBConfig::RegisterEncodeFunction(config,(EncodingFunction *)local_50);
  ::std::__cxx11::string::~string((string *)(local_50 + 0x10));
  ::std::__cxx11::string::~string((string *)&local_70);
  ::std::__cxx11::string::string((string *)&local_70,"utf-16",&local_71);
  EncodingFunction::EncodingFunction((EncodingFunction *)local_50,&local_70,DecodeUTF16ToUTF8,2,2);
  DBConfig::RegisterEncodeFunction(config,(EncodingFunction *)local_50);
  ::std::__cxx11::string::~string((string *)(local_50 + 0x10));
  ::std::__cxx11::string::~string((string *)&local_70);
  return;
}

Assistant:

void EncodingFunctionSet::Initialize(DBConfig &config) {
	config.RegisterEncodeFunction({"utf-8", DecodeUTF8, 1, 1});
	config.RegisterEncodeFunction({"latin-1", DecodeLatin1ToUTF8, 2, 1});
	config.RegisterEncodeFunction({"utf-16", DecodeUTF16ToUTF8, 2, 2});
}